

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

xmlHashTablePtr
xmlHashCopySafe(xmlHashTablePtr hash,xmlHashCopier copyFunc,xmlHashDeallocator deallocFunc)

{
  int iVar1;
  xmlHashTablePtr hash_00;
  void *payload;
  xmlHashEntry *pxVar2;
  char cVar3;
  xmlHashEntry *pxVar4;
  
  if (copyFunc == (xmlHashCopier)0x0 || hash == (xmlHashTablePtr)0x0) {
    return (xmlHashTablePtr)0x0;
  }
  hash_00 = xmlHashCreate(hash->size);
  if (hash_00 == (xmlHashTablePtr)0x0) {
LAB_00130ec7:
    hash_00 = (xmlHashTablePtr)0x0;
  }
  else if ((ulong)hash->size != 0) {
    pxVar2 = hash->table;
    pxVar4 = pxVar2 + hash->size;
    do {
      if (pxVar2->hashValue != 0) {
        payload = (*copyFunc)(pxVar2->payload,pxVar2->key);
        cVar3 = '\x05';
        if (payload != (void *)0x0) {
          iVar1 = xmlHashUpdateInternal
                            (hash_00,pxVar2->key,pxVar2->key2,pxVar2->key3,payload,
                             (xmlHashDeallocator)0x0,0);
          if (iVar1 < 1 && deallocFunc != (xmlHashDeallocator)0x0) {
            (*deallocFunc)(payload,pxVar2->key);
          }
          else {
            cVar3 = (iVar1 < 1) * '\x05';
          }
        }
        if (cVar3 != '\0') {
          if (cVar3 != '\x05') {
            return hash_00;
          }
          xmlHashFree(hash_00,deallocFunc);
          goto LAB_00130ec7;
        }
      }
      pxVar2 = pxVar2 + 1;
    } while (pxVar2 < pxVar4);
  }
  return hash_00;
}

Assistant:

xmlHashTablePtr
xmlHashCopySafe(xmlHashTablePtr hash, xmlHashCopier copyFunc,
                xmlHashDeallocator deallocFunc) {
    const xmlHashEntry *entry, *end;
    xmlHashTablePtr ret;

    if ((hash == NULL) || (copyFunc == NULL))
        return(NULL);

    ret = xmlHashCreate(hash->size);
    if (ret == NULL)
        return(NULL);

    if (hash->size == 0)
        return(ret);

    end = &hash->table[hash->size];

    for (entry = hash->table; entry < end; entry++) {
        if (entry->hashValue != 0) {
            void *copy;

            copy = copyFunc(entry->payload, entry->key);
            if (copy == NULL)
                goto error;
            if (xmlHashAdd3(ret, entry->key, entry->key2, entry->key3,
                            copy) <= 0) {
                if (deallocFunc != NULL)
                    deallocFunc(copy, entry->key);
                goto error;
            }
        }
    }

    return(ret);

error:
    xmlHashFree(ret, deallocFunc);
    return(NULL);
}